

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * xmlParserNsLookupSax(xmlParserCtxtPtr ctxt,xmlChar *prefix)

{
  int iVar1;
  undefined1 local_30 [4];
  int nsIndex;
  xmlHashedString hprefix;
  xmlChar *prefix_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (prefix == ctxt->str_xml) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    hprefix._0_8_ = prefix;
    hprefix.name = prefix;
    if (prefix == (xmlChar *)0x0) {
      local_30 = (undefined1  [4])0x0;
    }
    else {
      local_30 = (undefined1  [4])xmlDictComputeHash(ctxt->dict,prefix);
    }
    iVar1 = xmlParserNsLookup(ctxt,(xmlHashedString *)local_30,(xmlParserNsBucket **)0x0);
    if ((iVar1 == 0x7fffffff) || (iVar1 < ctxt->nsdb->minNsIndex)) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (xmlParserCtxtPtr)ctxt->nsdb->extra[iVar1].saxData;
    }
  }
  return ctxt_local;
}

Assistant:

void *
xmlParserNsLookupSax(xmlParserCtxtPtr ctxt, const xmlChar *prefix) {
    xmlHashedString hprefix;
    int nsIndex;

    if (prefix == ctxt->str_xml)
        return(NULL);

    hprefix.name = prefix;
    if (prefix != NULL)
        hprefix.hashValue = xmlDictComputeHash(ctxt->dict, prefix);
    else
        hprefix.hashValue = 0;
    nsIndex = xmlParserNsLookup(ctxt, &hprefix, NULL);
    if ((nsIndex == INT_MAX) || (nsIndex < ctxt->nsdb->minNsIndex))
        return(NULL);

    return(ctxt->nsdb->extra[nsIndex].saxData);
}